

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

kp_error_t kp_cfg_load(kp_ctx *ctx,char *sub)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  void *pvVar5;
  kp_safe *in_RSI;
  long in_RDI;
  char *pcVar6;
  long in_FS_OFFSET;
  char *value;
  char *key;
  config *config;
  char *save_line;
  char *line;
  kp_error_t ret;
  kp_safe cfg_safe;
  char path [4096];
  int in_stack_ffffffffffffdf7c;
  undefined4 in_stack_ffffffffffffdf80;
  undefined4 in_stack_ffffffffffffdf84;
  kp_ctx *ctx_00;
  kp_ctx *in_stack_ffffffffffffdf98;
  char *local_2050;
  char *local_2048;
  kp_error_t local_203c;
  kp_safe *local_2038;
  long local_2030;
  kp_error_t local_2024;
  int in_stack_ffffffffffffe02c;
  kp_safe *in_stack_ffffffffffffe030;
  kp_ctx *in_stack_ffffffffffffe038;
  char *local_1010;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2038 = in_RSI;
  local_2030 = in_RDI;
  memset(&stack0xffffffffffffeff8,0,0x1000);
  local_2048 = (char *)0x0;
  local_2050 = (char *)0x0;
  ctx_00 = (kp_ctx *)&stack0xffffffffffffeff8;
  sVar2 = strlen(&local_2038->open);
  pcVar6 = "/";
  if (sVar2 == 0) {
    pcVar6 = "";
  }
  iVar1 = snprintf((char *)ctx_00,0x1000,"%s%s.config",local_2038,pcVar6);
  if (iVar1 < 0x1000) {
    local_203c = kp_safe_init(in_stack_ffffffffffffdf98,local_2038,(char *)ctx_00);
    local_2024 = local_203c;
    if (((local_203c == 0) &&
        (local_203c = kp_safe_open(in_stack_ffffffffffffe038,in_stack_ffffffffffffe030,
                                   in_stack_ffffffffffffe02c), local_2024 = local_203c,
        local_203c == 0)) &&
       (((*(byte *)(local_2030 + 0x110be) & 1) == 0 ||
        (local_203c = kp_safe_store(ctx_00,(kp_safe *)
                                           CONCAT44(in_stack_ffffffffffffdf84,
                                                    in_stack_ffffffffffffdf80),
                                    in_stack_ffffffffffffdf7c), local_2024 = local_203c,
        local_203c == 0)))) {
      local_203c = 0;
      qsort(configs,2,0x20,config_sort);
      local_2048 = strtok_r(local_1010,"\n",&local_2050);
      while (local_2048 != (char *)0x0) {
        pcVar6 = strtok(local_2048,":");
        pcVar4 = strtok((char *)0x0,":");
        pvVar5 = bsearch(pcVar6,configs,2,0x20,config_search);
        if (pvVar5 != (void *)0x0) {
          (**(code **)((long)pvVar5 + 0x18))(pvVar5,local_2030,pcVar4);
        }
        local_2048 = strtok_r((char *)0x0,"\n",&local_2050);
      }
      local_203c = kp_safe_close(ctx_00,(kp_safe *)
                                        CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80
                                                ));
      local_2024 = local_203c;
      if (local_203c == 0) {
        local_2024 = 0;
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x24;
    local_2024 = 5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2024;
}

Assistant:

kp_error_t
kp_cfg_load(struct kp_ctx *ctx, const char *sub)
{
	kp_error_t ret;
	char path[PATH_MAX] = "";
	struct kp_safe cfg_safe;
	char *line = NULL, *save_line = NULL;

	if (snprintf(path, PATH_MAX, "%s%s" KP_CONFIG_SAFE_NAME,
	    sub, strlen(sub) == 0 ? "": "/") >= PATH_MAX) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	if ((ret = kp_safe_init(ctx, &cfg_safe, path)) != KP_SUCCESS) {
		return ret;
	}

	if ((ret = kp_safe_open(ctx, &cfg_safe, 0)) != KP_SUCCESS) {
		return ret;
	}

	if (ctx->agent.connected) {
		if ((ret = kp_safe_store(ctx, &cfg_safe, 3600)) != KP_SUCCESS) {
			return ret;
		}
	}

	qsort(configs, N_CONFIG, sizeof(struct config), config_sort);

	line = strtok_r(cfg_safe.metadata, "\n", &save_line);
	while (line != NULL) {
		struct config *config;
		char *key, *value;

		key = strtok(line, ":");
		value = strtok(NULL, ":");

		config = bsearch(key, configs, N_CONFIG, sizeof(struct config), config_search);
		if (config != NULL) {
			config->setter(config, ctx, value);
		}

		line = strtok_r(NULL, "\n", &save_line);
	}

	if ((ret = kp_safe_close(ctx, &cfg_safe)) != KP_SUCCESS) {
		return ret;
	}

	return KP_SUCCESS;
}